

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

void __thiscall spv::Builder::accessChainStore(Builder *this,Id rvalue)

{
  Id lValue;
  Id IVar1;
  Id vector;
  
  if ((this->accessChain).isRValue != false) {
    __assert_fail("accessChain.isRValue == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                  ,0x94e,"void spv::Builder::accessChainStore(Id)");
  }
  transferAccessChainSwizzle(this,true);
  lValue = collapseAccessChain(this);
  if ((this->accessChain).swizzle.
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->accessChain).swizzle.
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    if ((this->accessChain).component != 0) {
LAB_0019c6fa:
      vector = createLoad(this,lValue);
      IVar1 = (this->accessChain).component;
      goto LAB_0019c70c;
    }
  }
  else {
    IVar1 = createLoad(this,lValue);
    vector = createLvalueSwizzle(this,(this->module).idToInstruction.
                                      super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[IVar1]->typeId,IVar1
                                 ,rvalue,&(this->accessChain).swizzle);
    IVar1 = (this->accessChain).component;
    if (IVar1 != 0) {
      if (vector == 0) goto LAB_0019c6fa;
LAB_0019c70c:
      vector = createVectorInsertDynamic
                         (this,vector,
                          (this->module).idToInstruction.
                          super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[vector]->typeId,rvalue,IVar1);
    }
    if (vector != 0) goto LAB_0019c72e;
  }
  vector = rvalue;
LAB_0019c72e:
  createStore(this,vector,lValue);
  return;
}

Assistant:

void Builder::accessChainStore(Id rvalue)
{
    assert(accessChain.isRValue == false);

    transferAccessChainSwizzle(true);
    Id base = collapseAccessChain();

    // If swizzle still exists, it is out-of-order or not full, we must load the target vector,
    // extract and insert elements to perform writeMask and/or swizzle.
    Id source = NoResult;
    if (accessChain.swizzle.size()) {
        Id tempBaseId = createLoad(base);
        source = createLvalueSwizzle(getTypeId(tempBaseId), tempBaseId, rvalue, accessChain.swizzle);
    }

    // dynamic component selection
    if (accessChain.component != NoResult) {
        Id tempBaseId = (source == NoResult) ? createLoad(base) : source;
        source = createVectorInsertDynamic(tempBaseId, getTypeId(tempBaseId), rvalue, accessChain.component);
    }

    if (source == NoResult)
        source = rvalue;

    createStore(source, base);
}